

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O1

void __thiscall
cs::statement_function::statement_function
          (statement_function *this,string *name,string *decl,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body,
          bool is_override,bool is_vargs,context_t *c,token_base *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  undefined8 uVar6;
  context_t local_d8;
  function *local_c8;
  undefined **local_c0;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_80;
  
  peVar3 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_0025e3f0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  (this->super_statement_base).line_num = ptr->line_num;
  (this->super_statement_base)._vptr_statement_base =
       (_func_int **)&PTR__statement_function_0025f5b8;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar6;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar5;
    (this->mName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  pcVar5 = (decl->_M_dataplus)._M_p;
  local_c0 = &PTR__statement_base_0025e3f0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar5,pcVar5 + decl->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,args);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,body);
  local_c8 = &this->mFunc;
  cs::function::function
            (local_c8,&local_d8,&local_b8,&this->super_statement_base,&local_98,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,
             is_vargs,false);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  this->mOverride = is_override;
  this->mIsMemFn = false;
  (this->mDecl)._M_dataplus._M_p = (pointer)&(this->mDecl).field_2;
  pcVar5 = (decl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mDecl,pcVar5,pcVar5 + decl->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mArgs,args);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque(&this->mBlock,body)
  ;
  return;
}

Assistant:

statement_function(std::string name, const std::string &decl, const std::vector<std::string> &args,
		                   const std::deque<statement_base *> &body, bool is_override, bool is_vargs,
		                   const context_t &c,
		                   token_base *ptr)
			: statement_base(c, ptr), mName(std::move(name)), mFunc(c, decl, this, args, body, is_vargs),
			  mOverride(is_override), mDecl(decl), mArgs(args), mBlock(body) {}